

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::RangeSelectExpression::fromSyntax
          (RangeSelectExpression *this,Compilation *compilation,Expression *value,
          RangeSelectSyntax *syntax,SourceRange fullRange,ASTContext *context)

{
  byte **this_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange valueRange_00;
  __index_type _Var1;
  bool bVar2;
  int iVar3;
  _Storage<int,_true> _Var4;
  Type *pTVar5;
  Expression *pEVar6;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  Expression *args_4;
  Type *this_01;
  optional<int> oVar8;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_02;
  Diagnostic *pDVar9;
  SourceLocation this_03;
  Diagnostic *this_04;
  logic_error *this_05;
  int iVar10;
  _Storage<slang::ConstantRange,_true> *args_1;
  int32_t l;
  socklen_t __len;
  anon_class_40_5_26fa91f2 *this_06;
  _Storage<int,_true> arg;
  SourceRange SVar12;
  SourceRange range;
  optional<slang::ConstantRange> oVar13;
  RangeSelectionKind selectionKind;
  char local_139;
  ConstantRange valueRange;
  RangeSelectExpression *result;
  anon_class_40_5_26fa91f2 validateRange;
  SourceRange errorRange;
  SourceRange fullRange_local;
  ConstantValue leftVal;
  _Storage<slang::ConstantRange,_true> local_78 [4];
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  undefined4 extraout_var_00;
  SourceLocation SVar11;
  
  this_03 = fullRange.endLoc;
  SVar11 = fullRange.startLoc;
  iVar3 = *(int *)&(value->type).ptr;
  fullRange_local.startLoc = (SourceLocation)syntax;
  fullRange_local.endLoc = SVar11;
  if (iVar3 == 0x1b) {
    selectionKind = IndexedUp;
  }
  else if (iVar3 == 0x88) {
    selectionKind = IndexedDown;
  }
  else {
    if (iVar3 != 0x19b) {
      this_05 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/SelectExpressions.cpp"
                 ,(allocator<char> *)&valueRange);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &errorRange,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     ":");
      std::__cxx11::to_string((string *)&local_78[0]._M_value,0x1a2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &errorRange,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_78[0]._M_value);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&leftVal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     ": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &validateRange,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&leftVal,
                     "Default case should be unreachable!");
      std::logic_error::logic_error(this_05,(string *)&validateRange);
      __cxa_throw(this_05,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    selectionKind = Simple;
  }
  bVar2 = Expression::bad((Expression *)compilation);
  if (!bVar2) {
    pTVar5 = not_null<const_slang::ast::Type_*>::get
                       ((not_null<const_slang::ast::Type_*> *)
                        &(compilation->super_BumpAllocator).endPtr);
    bVar2 = Type::isAssociativeArray(pTVar5);
    if (bVar2) {
      SVar12.endLoc = SVar11;
      SVar12.startLoc = (SourceLocation)syntax;
      ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x7a0007,SVar12);
      pEVar6 = Expression::badExpr((Compilation *)this,(Expression *)0x0);
      return pEVar6;
    }
  }
  this_00 = &(compilation->super_BumpAllocator).endPtr;
  pTVar5 = not_null<const_slang::ast::Type_*>::get((not_null<const_slang::ast::Type_*> *)this_00);
  local_139 = Type::isQueue(pTVar5);
  __len = 0x1800;
  if (!(bool)local_139) {
    __len = 0;
  }
  pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)&value->constant);
  iVar3 = Expression::bind((int)pEVar7,(sockaddr *)this_03,__len);
  pEVar6 = (Expression *)CONCAT44(extraout_var,iVar3);
  pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)&(value->sourceRange).endLoc);
  iVar3 = Expression::bind((int)pEVar7,(sockaddr *)this_03,__len);
  args_4 = (Expression *)CONCAT44(extraout_var_00,iVar3);
  result = BumpAllocator::
           emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const&,slang::ast::Expression_const&,slang::SourceRange&>
                     ((BumpAllocator *)this,&selectionKind,*(Type **)&this[4].super_Expression,
                      (Expression *)compilation,pEVar6,args_4,&fullRange_local);
  bVar2 = Expression::bad((Expression *)compilation);
  if (((bVar2) || (bVar2 = Expression::bad(pEVar6), bVar2)) ||
     (bVar2 = Expression::bad(args_4), bVar2)) goto LAB_0032609a;
  pTVar5 = not_null<const_slang::ast::Type_*>::get(&pEVar6->type);
  bVar2 = Type::isUnbounded(pTVar5);
  if ((!bVar2) && (bVar2 = ASTContext::requireIntegral((ASTContext *)this_03,pEVar6), !bVar2))
  goto LAB_0032609a;
  pTVar5 = not_null<const_slang::ast::Type_*>::get(&args_4->type);
  bVar2 = Type::isUnbounded(pTVar5);
  if ((!bVar2) && (bVar2 = ASTContext::requireIntegral((ASTContext *)this_03,args_4), !bVar2))
  goto LAB_0032609a;
  pTVar5 = not_null<const_slang::ast::Type_*>::get((not_null<const_slang::ast::Type_*> *)this_00);
  SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)value);
  SVar11 = SVar12.endLoc;
  valueRange_00.startLoc._0_4_ = (compilation->options).maxConstexprBacktrace;
  valueRange_00.startLoc._4_4_ = (compilation->options).maxDefParamSteps;
  valueRange_00.endLoc._0_4_ = (compilation->options).maxInstanceArray;
  valueRange_00.endLoc._4_4_ = (compilation->options).errorLimit;
  this_01 = getIndexedType((Compilation *)this,(ASTContext *)this_03,pTVar5,SVar12,valueRange_00,
                           true);
  bVar2 = Type::isError(this_01);
  if (bVar2) goto LAB_0032609a;
  range.endLoc = this_03;
  range.startLoc = fullRange_local.endLoc;
  checkForVectoredSelect
            ((ast *)compilation,(Expression *)fullRange_local.startLoc,range,(ASTContext *)SVar11);
  bVar2 = Type::hasFixedRange(pTVar5);
  if ((!bVar2) && ((*(byte *)((long)this_03 + 0x10) & 0x80) != 0)) {
    sourceRange_03.endLoc = fullRange_local.endLoc;
    sourceRange_03.startLoc = fullRange_local.startLoc;
    ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x420007,sourceRange_03);
    goto LAB_0032609a;
  }
  if (local_139 != '\0') goto LAB_003260f8;
  if (((ulong)*(pointer *)((long)this_03 + 0x10) >> 0x23 & 1) == 0) goto LAB_0032614e;
  if (((ulong)*(pointer *)((long)this_03 + 0x10) & 2) == 0) {
    ASTContext::tryEval((ConstantValue *)&validateRange,(ASTContext *)this_03,args_4);
    if ((char)validateRange.result != '\0') {
      if (selectionKind == Simple) {
        ASTContext::tryEval(&leftVal,(ASTContext *)this_03,pEVar6);
        _Var1 = leftVal.value.
                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ._M_index;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&leftVal);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&validateRange);
        if (_Var1 == '\0') goto LAB_003260f8;
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&validateRange);
      }
LAB_0032614e:
      oVar8 = ASTContext::evalInteger((ASTContext *)this_03,args_4);
      if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) goto LAB_0032609a;
      errorRange.startLoc = (pEVar6->sourceRange).startLoc;
      errorRange.endLoc = (args_4->sourceRange).endLoc;
      bVar2 = Type::hasFixedRange(pTVar5);
      arg._M_value = oVar8.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload;
      if (bVar2) {
        local_78[0] = (_Storage<slang::ConstantRange,_true>)0x0;
        valueRange = Type::getFixedRange(pTVar5);
        validateRange.valueRange = &valueRange;
        validateRange.errorRange = &errorRange;
        validateRange.result = &result;
        validateRange.context = (ASTContext *)this_03;
        validateRange.valueType = pTVar5;
        if (selectionKind == Simple) {
          oVar8 = ASTContext::evalInteger((ASTContext *)this_03,pEVar6);
          if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> & 0x100000000) == 0) goto LAB_0032609a;
          _Var4._M_value =
               oVar8.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          local_78[0]._M_value.right = arg._M_value;
          local_78[0]._M_value.left = _Var4._M_value;
          if ((_Var4._M_value != arg._M_value) &&
             (arg._M_value <= _Var4._M_value == valueRange.left < valueRange.right)) {
            sourceRange.endLoc = errorRange.endLoc;
            sourceRange.startLoc = errorRange.startLoc;
            pDVar9 = ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x840007,sourceRange);
LAB_0032646b:
            ast::operator<<(pDVar9,pTVar5);
LAB_0032609a:
            pEVar6 = Expression::badExpr((Compilation *)this,&result->super_Expression);
            return pEVar6;
          }
          if ((*(byte *)((long)this_03 + 0x10) & 2) == 0) {
            fromSyntax::anon_class_40_5_26fa91f2::operator()(&validateRange,local_78[0]._M_value);
          }
        }
        else {
          bVar2 = ASTContext::requireGtZero((ASTContext *)this_03,oVar8,args_4->sourceRange);
          if (!bVar2) goto LAB_0032609a;
          leftVal.value.
          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ._M_index = '\0';
          if ((*(byte *)((long)this_03 + 0x10) & 2) == 0) {
            ASTContext::tryEval((ConstantValue *)&local_58,(ASTContext *)this_03,pEVar6);
            std::__detail::__variant::
            _Move_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::operator=((_Move_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&leftVal,
                        (_Move_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_58);
            _Var1 = leftVal.value.
                    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ._M_index;
            SVar11._1_7_ = (undefined7)((ulong)&leftVal >> 8);
            SVar11._0_1_ = leftVal.value.
                           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           .
                           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           ._M_index;
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_58);
            if (_Var1 == '\0') goto LAB_003264c4;
            this_02 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                (&leftVal.value);
            oVar8 = SVInt::as<int,void>(this_02);
            if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int> & 0x100000000) == 0) {
              pDVar9 = ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x510007,
                                           pEVar6->sourceRange);
              Diagnostic::operator<<(pDVar9,&leftVal);
              ast::operator<<(pDVar9,pTVar5);
              this_03 = (SourceLocation)
                        Expression::badExpr((Compilation *)this,&result->super_Expression);
              goto LAB_0032659e;
            }
            oVar13 = ConstantRange::getIndexedRange
                               (oVar8.super__Optional_base<int,_true,_true>._M_payload.
                                super__Optional_payload_base<int>._M_payload,arg._M_value,
                                valueRange.right <= valueRange.left,selectionKind == IndexedUp);
            if (((undefined1  [12])
                 oVar13.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
                (undefined1  [12])0x0) {
              sourceRange_02.endLoc = errorRange.endLoc;
              sourceRange_02.startLoc = errorRange.startLoc;
              ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x7b0007,sourceRange_02);
              this_03 = (SourceLocation)
                        Expression::badExpr((Compilation *)this,&result->super_Expression);
              goto LAB_0032659e;
            }
            local_78[0] = oVar13.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::ConstantRange>._M_payload;
            fromSyntax::anon_class_40_5_26fa91f2::operator()
                      (&validateRange,
                       oVar13.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value);
            bVar2 = true;
            this_03 = SVar11;
          }
          else {
LAB_003264c4:
            if (selectionKind == IndexedUp) {
              l = valueRange.left;
              if (valueRange.right < valueRange.left) {
                l = valueRange.right;
              }
            }
            else {
              l = valueRange.right;
              if (valueRange.right < valueRange.left) {
                l = valueRange.left;
              }
            }
            oVar13 = ConstantRange::getIndexedRange
                               (l,arg._M_value,valueRange.right <= valueRange.left,
                                selectionKind == IndexedUp);
            if (((undefined1  [12])
                 oVar13.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
                (undefined1  [12])0x0) {
              sourceRange_01.endLoc = errorRange.endLoc;
              sourceRange_01.startLoc = errorRange.startLoc;
              ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x7b0007,sourceRange_01);
              this_03 = (SourceLocation)
                        Expression::badExpr((Compilation *)this,&result->super_Expression);
LAB_0032659e:
              bVar2 = false;
            }
            else {
              iVar10 = valueRange.left - valueRange.right;
              iVar3 = -iVar10;
              if (0 < iVar10) {
                iVar3 = iVar10;
              }
              bVar2 = true;
              local_78[0] = oVar13.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload
                            .super__Optional_payload_base<slang::ConstantRange>._M_payload;
              if ((uint)(iVar3 + 1) < (uint)arg) {
                this_03 = (SourceLocation)
                          ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x9f0007,
                                              args_4->sourceRange);
                Diagnostic::operator<<((Diagnostic *)this_03,arg._M_value);
                ast::operator<<((Diagnostic *)this_03,pTVar5);
              }
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&leftVal);
          if (!bVar2) {
            return (Expression *)this_03;
          }
        }
        bVar2 = Type::isUnpackedArray(pTVar5);
        args_1 = local_78;
        if (!bVar2) {
          local_58._0_8_ =
               BumpAllocator::
               emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                         ((BumpAllocator *)this,this_01,&args_1->_M_value);
          this_06 = (anon_class_40_5_26fa91f2 *)&leftVal;
          not_null<slang::ast::Type_const*>::not_null<slang::ast::PackedArrayType*,void>
                    ((not_null<slang::ast::Type_const*> *)this_06,(PackedArrayType **)&local_58);
          goto LAB_00326126;
        }
      }
      else {
        if (selectionKind == Simple) {
          oVar8 = ASTContext::evalInteger((ASTContext *)this_03,pEVar6);
          if (((ulong)oVar8.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> & 0x100000000) == 0) goto LAB_0032609a;
          _Var4._M_value =
               oVar8.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          validateRange.valueRange = (ConstantRange *)CONCAT44(arg._M_value,_Var4._M_value);
          if (arg._M_value < _Var4._M_value) {
            sourceRange_00.endLoc = errorRange.endLoc;
            sourceRange_00.startLoc = errorRange.startLoc;
            pDVar9 = ASTContext::addDiag((ASTContext *)this_03,(DiagCode)0x830007,sourceRange_00);
            this_04 = Diagnostic::operator<<(pDVar9,_Var4._M_value);
            Diagnostic::operator<<(this_04,arg._M_value);
            goto LAB_0032646b;
          }
        }
        else {
          bVar2 = ASTContext::requireGtZero((ASTContext *)this_03,oVar8,args_4->sourceRange);
          if (!bVar2) goto LAB_0032609a;
          validateRange.valueRange = (ConstantRange *)((ulong)(arg._M_value - 1) << 0x20);
        }
        args_1 = (_Storage<slang::ConstantRange,_true> *)&validateRange;
      }
      local_58._0_8_ =
           BumpAllocator::
           emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                     ((BumpAllocator *)this,this_01,&args_1->_M_value);
      this_06 = (anon_class_40_5_26fa91f2 *)&leftVal;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::FixedSizeUnpackedArrayType*,void>
                ((not_null<slang::ast::Type_const*> *)this_06,
                 (FixedSizeUnpackedArrayType **)&local_58);
      goto LAB_00326126;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&validateRange);
  }
LAB_003260f8:
  local_58._0_8_ = (ulong)(uint)local_58._4_4_ << 0x20;
  leftVal.value.
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._M_u._0_8_ = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                          ((BumpAllocator *)this,this_01,(uint *)&local_58);
  this_06 = &validateRange;
  not_null<slang::ast::Type_const*>::not_null<slang::ast::QueueType*,void>
            ((not_null<slang::ast::Type_const*> *)this_06,(QueueType **)&leftVal);
LAB_00326126:
  (result->super_Expression).type.ptr = (Type *)this_06->valueRange;
  return &result->super_Expression;
}

Assistant:

Expression& RangeSelectExpression::fromSyntax(Compilation& compilation, Expression& value,
                                              const RangeSelectSyntax& syntax,
                                              SourceRange fullRange, const ASTContext& context) {
    // Left and right are either the extents of a part-select, in which case they must
    // both be constant, or the left hand side is the start and the right hand side is
    // the width of an indexed part select, in which case only the rhs need be constant.
    RangeSelectionKind selectionKind;
    switch (syntax.kind) {
        case SyntaxKind::SimpleRangeSelect:
            selectionKind = RangeSelectionKind::Simple;
            break;
        case SyntaxKind::AscendingRangeSelect:
            selectionKind = RangeSelectionKind::IndexedUp;
            break;
        case SyntaxKind::DescendingRangeSelect:
            selectionKind = RangeSelectionKind::IndexedDown;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!value.bad() && value.type->isAssociativeArray()) {
        context.addDiag(diag::RangeSelectAssociative, fullRange);
        return badExpr(compilation, nullptr);
    }

    // Selection expressions don't need to be const if we're selecting from a queue.
    bitmask<ASTFlags> extraFlags;
    bool isQueue = value.type->isQueue();
    if (isQueue)
        extraFlags = ASTFlags::AllowUnboundedLiteral | ASTFlags::AllowUnboundedLiteralArithmetic;

    auto& left = bind(*syntax.left, context, extraFlags);
    auto& right = bind(*syntax.right, context, extraFlags);

    auto result = compilation.emplace<RangeSelectExpression>(selectionKind,
                                                             compilation.getErrorType(), value,
                                                             left, right, fullRange);

    if (value.bad() || left.bad() || right.bad())
        return badExpr(compilation, result);

    if (!left.type->isUnbounded() && !context.requireIntegral(left))
        return badExpr(compilation, result);

    if (!right.type->isUnbounded() && !context.requireIntegral(right))
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, syntax.sourceRange(),
                                             value.sourceRange, true);
    if (elementType.isError())
        return badExpr(compilation, result);

    // Selects of vectored nets are disallowed.
    checkForVectoredSelect(value, fullRange, context);

    if (!valueType.hasFixedRange() && context.flags.has(ASTFlags::NonProcedural)) {
        context.addDiag(diag::DynamicNotProcedural, fullRange);
        return badExpr(compilation, result);
    }

    // If this is selecting from a queue, the result is always a queue.
    if (isQueue) {
        result->type = compilation.emplace<QueueType>(elementType, 0u);
        return *result;
    }

    // If this is a streaming concatenation's "with" range, we also don't
    // require a constant width, but we'll try to validate it if we see
    // that the bounds are constant anyway.
    if (context.flags.has(ASTFlags::StreamingWithRange)) {
        if (context.inUnevaluatedBranch() || !context.tryEval(right) ||
            (selectionKind == RangeSelectionKind::Simple && !context.tryEval(left))) {
            result->type = compilation.emplace<QueueType>(elementType, 0u);
            return *result;
        }
    }

    std::optional<int32_t> rv = context.evalInteger(right);
    if (!rv)
        return badExpr(compilation, result);

    // If the array type has a fixed range, validate that the range we're selecting is allowed.
    SourceRange errorRange{left.sourceRange.start(), right.sourceRange.end()};
    if (valueType.hasFixedRange()) {
        ConstantRange selectionRange;
        ConstantRange valueRange = valueType.getFixedRange();

        // Helper function for validating the bounds of the selection.
        auto validateRange = [&](ConstantRange range) {
            if (!valueRange.containsPoint(range.left) || !valueRange.containsPoint(range.right)) {
                auto& diag = context.addDiag(diag::RangeOOB, errorRange);
                diag << range.left << range.right;
                diag << valueType;

                result->warnedAboutRange = true;
            }
        };

        if (selectionKind == RangeSelectionKind::Simple) {
            std::optional<int32_t> lv = context.evalInteger(left);
            if (!lv)
                return badExpr(compilation, result);

            selectionRange = {*lv, *rv};
            if (selectionRange.isLittleEndian() != valueRange.isLittleEndian() &&
                selectionRange.width() > 1) {
                auto& diag = context.addDiag(diag::SelectEndianMismatch, errorRange);
                diag << valueType;
                return badExpr(compilation, result);
            }

            if (!context.inUnevaluatedBranch())
                validateRange(selectionRange);
        }
        else {
            if (!context.requireGtZero(rv, right.sourceRange))
                return badExpr(compilation, result);

            // If the lhs is a known constant, we can check that now too.
            ConstantValue leftVal;
            if (!context.inUnevaluatedBranch() && (leftVal = context.tryEval(left))) {
                std::optional<int32_t> index = leftVal.integer().as<int32_t>();
                if (!index) {
                    auto& diag = context.addDiag(diag::IndexValueInvalid, left.sourceRange);
                    diag << leftVal;
                    diag << valueType;
                    return badExpr(compilation, result);
                }

                auto range =
                    ConstantRange::getIndexedRange(*index, *rv, valueRange.isLittleEndian(),
                                                   selectionKind == RangeSelectionKind::IndexedUp);
                if (!range) {
                    context.addDiag(diag::RangeWidthOverflow, errorRange);
                    return badExpr(compilation, result);
                }

                selectionRange = *range;
                validateRange(selectionRange);
            }
            else {
                // Otherwise, the resulting range will start with the fixed lower bound of the type.
                int32_t l = selectionKind == RangeSelectionKind::IndexedUp ? valueRange.lower()
                                                                           : valueRange.upper();
                auto range = ConstantRange::getIndexedRange(l, *rv, valueRange.isLittleEndian(),
                                                            selectionKind ==
                                                                RangeSelectionKind::IndexedUp);
                if (!range) {
                    context.addDiag(diag::RangeWidthOverflow, errorRange);
                    return badExpr(compilation, result);
                }

                selectionRange = *range;

                if (bitwidth_t(*rv) > valueRange.width()) {
                    auto& diag = context.addDiag(diag::RangeWidthOOB, right.sourceRange);
                    diag << *rv;
                    diag << valueType;
                }
            }
        }

        // At this point, all expressions are good, ranges have been validated and
        // we know the final width of the selection, so pick the result type and we're done.
        if (valueType.isUnpackedArray()) {
            result->type = compilation.emplace<FixedSizeUnpackedArrayType>(elementType,
                                                                           selectionRange);
        }
        else {
            result->type = compilation.emplace<PackedArrayType>(elementType, selectionRange);
        }
    }
    else {
        // Otherwise, this is a dynamic array so we can't validate much. We should check that
        // the selection endianness is correct for simple ranges -- dynamic arrays only
        // permit big endian [0..N] ordering.
        ConstantRange selectionRange;
        if (selectionKind == RangeSelectionKind::Simple) {
            std::optional<int32_t> lv = context.evalInteger(left);
            if (!lv)
                return badExpr(compilation, result);

            selectionRange = {*lv, *rv};
            if (selectionRange.isLittleEndian() && selectionRange.width() > 1) {
                auto& diag = context.addDiag(diag::SelectEndianDynamic, errorRange);
                diag << selectionRange.left << selectionRange.right;
                diag << valueType;
                return badExpr(compilation, result);
            }
        }
        else {
            if (!context.requireGtZero(rv, right.sourceRange))
                return badExpr(compilation, result);

            selectionRange.left = 0;
            selectionRange.right = *rv - 1;
        }

        result->type = compilation.emplace<FixedSizeUnpackedArrayType>(elementType, selectionRange);
    }

    return *result;
}